

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.cpp
# Opt level: O0

void __thiscall MinVR::VRMain::renderOnAllDisplays(VRMain *this)

{
  bool bVar1;
  runtime_error *this_00;
  reference ppVVar2;
  vector<MinVR::VRRenderHandler_*,_std::allocator<MinVR::VRRenderHandler_*>_> *in_RDI;
  iterator it_2;
  iterator it_1;
  iterator it;
  VRCompositeRenderHandler compositeHandler;
  VRDataIndex renderState;
  string *in_stack_fffffffffffffe68;
  VRDataIndex *in_stack_fffffffffffffe70;
  VRDataIndex *this_01;
  vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *in_stack_fffffffffffffe80
  ;
  VRCompositeRenderHandler *in_stack_fffffffffffffe90;
  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  local_168;
  VRDataIndex *in_stack_fffffffffffffea0;
  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  in_stack_fffffffffffffeb8;
  VRInt value;
  string *in_stack_fffffffffffffec0;
  VRDataIndex *in_stack_fffffffffffffec8;
  undefined1 local_119 [33];
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [176];
  
  value = (VRInt)((ulong)in_stack_fffffffffffffeb8._M_current >> 0x20);
  if (((ulong)in_RDI[0x21].
              super__Vector_base<MinVR::VRRenderHandler_*,_std::allocator<MinVR::VRRenderHandler_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) {
    VRDataIndex::VRDataIndex(in_stack_fffffffffffffea0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8._M_current,
               (allocator<char> *)in_stack_fffffffffffffea0);
    VRDataIndex::setName(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    this_01 = (VRDataIndex *)local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8._M_current,
               (allocator<char> *)in_stack_fffffffffffffea0);
    VRDataIndex::addData(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,value);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string((string *)(local_119 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_119);
    bVar1 = std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::empty
                      (in_stack_fffffffffffffe80);
    if (!bVar1) {
      VRCompositeRenderHandler::VRCompositeRenderHandler(in_stack_fffffffffffffe90,in_RDI);
      std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::begin
                ((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)
                 in_stack_fffffffffffffe68);
      while( true ) {
        std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::end
                  ((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)
                   in_stack_fffffffffffffe68);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                            *)this_01,
                           (__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                            *)in_stack_fffffffffffffe68);
        if (!bVar1) break;
        ppVVar2 = __gnu_cxx::
                  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                  ::operator*((__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                               *)&stack0xfffffffffffffeb8);
        (*(*ppVVar2)->_vptr_VRDisplayNode[4])(*ppVVar2,local_b0,&stack0xfffffffffffffec0);
        __gnu_cxx::
        __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
        ::operator++((__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                      *)&stack0xfffffffffffffeb8);
      }
      std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::begin
                ((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)
                 in_stack_fffffffffffffe68);
      while( true ) {
        std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::end
                  ((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)
                   in_stack_fffffffffffffe68);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                            *)this_01,
                           (__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                            *)in_stack_fffffffffffffe68);
        if (!bVar1) break;
        ppVVar2 = __gnu_cxx::
                  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                  ::operator*((__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                               *)&stack0xfffffffffffffea8);
        (*(*ppVVar2)->_vptr_VRDisplayNode[5])(*ppVVar2,local_b0);
        __gnu_cxx::
        __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
        ::operator++((__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                      *)&stack0xfffffffffffffea8);
      }
      VRCompositeRenderHandler::~VRCompositeRenderHandler((VRCompositeRenderHandler *)0x122cba);
    }
    if (in_RDI[0x24].
        super__Vector_base<MinVR::VRRenderHandler_*,_std::allocator<MinVR::VRRenderHandler_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*in_RDI[0x24].
                  super__Vector_base<MinVR::VRRenderHandler_*,_std::allocator<MinVR::VRRenderHandler_*>_>
                  ._M_impl.super__Vector_impl_data._M_start)[1]._vptr_VRRenderHandler)();
    }
    bVar1 = std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::empty
                      (in_stack_fffffffffffffe80);
    if (!bVar1) {
      local_168._M_current =
           (VRDisplayNode **)
           std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::begin
                     ((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)
                      in_stack_fffffffffffffe68);
      while( true ) {
        std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::end
                  ((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)
                   in_stack_fffffffffffffe68);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                            *)this_01,
                           (__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                            *)in_stack_fffffffffffffe68);
        if (!bVar1) break;
        ppVVar2 = __gnu_cxx::
                  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                  ::operator*(&local_168);
        (*(*ppVVar2)->_vptr_VRDisplayNode[6])(*ppVVar2,local_b0);
        __gnu_cxx::
        __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
        ::operator++(&local_168);
      }
    }
    *(int *)&in_RDI[0x2d].
             super__Vector_base<MinVR::VRRenderHandler_*,_std::allocator<MinVR::VRRenderHandler_*>_>
             ._M_impl.super__Vector_impl_data._M_finish =
         *(int *)&in_RDI[0x2d].
                  super__Vector_base<MinVR::VRRenderHandler_*,_std::allocator<MinVR::VRRenderHandler_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 1;
    VRDataIndex::~VRDataIndex(this_01);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"VRMain not initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VRMain::renderOnAllDisplays() {

  if (!_initialized) throw std::runtime_error("VRMain not initialized.");

	VRDataIndex renderState;
  renderState.setName("RenderState");
	renderState.addData("InitRender", (int)(_frame == 0));

	if (!_displayGraphs.empty()) {
		VRCompositeRenderHandler compositeHandler(_renderHandlers);
		for (std::vector<VRDisplayNode*>::iterator it = _displayGraphs.begin(); it != _displayGraphs.end(); ++it) (*it)->render(&renderState, &compositeHandler);

		// TODO: Advanced: if you are really trying to optimize performance, this
		// is where you might want to add an idle callback.  Here, it's
		// possible that the CPU is idle, but the GPU is still processing
		// graphics comamnds.

		for (std::vector<VRDisplayNode*>::iterator it = _displayGraphs.begin(); it != _displayGraphs.end(); ++it) (*it)->waitForRenderToComplete(&renderState);
	}

	// SYNCHRONIZATION POINT #2: When this function returns we know that
	// all nodes have finished rendering on all their attached display
	// devices.  So, after this, we will be ready to "swap buffers",
	// simultaneously displaying these new renderings on all nodes.
	if (_net != NULL) {
		_net->syncSwapBuffersAcrossAllNodes();
	}

	if (!_displayGraphs.empty()) {
		for (std::vector<VRDisplayNode*>::iterator it = _displayGraphs.begin(); it != _displayGraphs.end(); ++it) (*it)->displayFinishedRendering(&renderState);
	}

	_frame++;
}